

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * cfd::core::ScriptUtil::CreateMultisigRedeemScript
                   (Script *__return_storage_ptr__,uint32_t require_signature_num,
                   vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys,
                   bool has_witness)

{
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *this;
  bool bVar1;
  uint uVar2;
  CfdException *pCVar3;
  ulong uVar4;
  size_type sVar5;
  ScriptBuilder *this_00;
  allocator local_289;
  string local_288;
  CfdSourceLocation local_268;
  undefined1 local_249;
  reference local_248;
  Pubkey *pubkey;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range2;
  ScriptBuilder builder;
  ScriptElement op_pubkey_num;
  ScriptElement op_require_num;
  string local_140;
  CfdSourceLocation local_120;
  ulong local_108;
  size_t max_num;
  string local_f8;
  size_type local_d8;
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0;
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  byte local_21;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pvStack_20;
  bool has_witness_local;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys_local;
  Script *pSStack_10;
  uint32_t require_signature_num_local;
  Script *redeem_script;
  
  local_21 = has_witness;
  pvStack_20 = pubkeys;
  pubkeys_local._4_4_ = require_signature_num;
  pSStack_10 = __return_storage_ptr__;
  if (require_signature_num == 0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x5d1;
    local_40.funcname = "CreateMultisigRedeemScript";
    logger::warn<>(&local_40,"Invalid require_sig_num. require_sig_num = 0");
    local_75 = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_60,"CreateMultisigScript require_num is 0.",&local_61);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_60);
    local_75 = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::empty(pubkeys);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x5d7;
    local_90.funcname = "CreateMultisigRedeemScript";
    logger::warn<>(&local_90,"pubkey array is empty.");
    local_b2 = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_b0,"CreateMultisigScript empty pubkey array.",&local_b1);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_b0);
    local_b2 = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar4 = (ulong)pubkeys_local._4_4_;
  sVar5 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size(pvStack_20);
  if (sVar5 < uVar4) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x5de;
    local_d0.funcname = "CreateMultisigRedeemScript";
    local_d8 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size
                         (pvStack_20);
    logger::warn<unsigned_int&,unsigned_long>
              (&local_d0,"Invalid require_sig_num. require_sig_num={0}, pubkey size={1}.",
               (uint *)((long)&pubkeys_local + 4),&local_d8);
    max_num._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_f8,"CreateMultisigScript require_num is over.",
               (allocator *)((long)&max_num + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_f8);
    max_num._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar2 = 0xf;
  if ((local_21 & 1) != 0) {
    uVar2 = 0x14;
  }
  local_108 = (ulong)uVar2;
  sVar5 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size(pvStack_20);
  if (sVar5 <= local_108) {
    ScriptElement::ScriptElement((ScriptElement *)&op_pubkey_num.value_,(ulong)pubkeys_local._4_4_);
    sVar5 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size(pvStack_20);
    ScriptElement::ScriptElement
              ((ScriptElement *)
               &builder.script_byte_array_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar5);
    ScriptBuilder::ScriptBuilder((ScriptBuilder *)&__range2);
    ScriptBuilder::operator<<((ScriptBuilder *)&__range2,(ScriptElement *)&op_pubkey_num.value_);
    this = pvStack_20;
    __end2 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin(pvStack_20)
    ;
    pubkey = (Pubkey *)
             ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                                       *)&pubkey), bVar1) {
      local_248 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  ::operator*(&__end2);
      ScriptBuilder::operator<<((ScriptBuilder *)&__range2,local_248);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
      ::operator++(&__end2);
    }
    this_00 = ScriptBuilder::operator<<
                        ((ScriptBuilder *)&__range2,
                         (ScriptElement *)
                         &builder.script_byte_array_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    ScriptBuilder::operator<<(this_00,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIG);
    local_249 = 0;
    ScriptBuilder::Build(__return_storage_ptr__,(ScriptBuilder *)&__range2);
    if (((local_21 & 1) == 0) && (bVar1 = IsValidRedeemScript(__return_storage_ptr__), !bVar1)) {
      local_268.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_script.cpp"
                   ,0x2f);
      local_268.filename = local_268.filename + 1;
      local_268.line = 0x5f8;
      local_268.funcname = "CreateMultisigRedeemScript";
      logger::warn<>(&local_268,"Multisig script size is over.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_288,"CreateMultisigScript multisig script size is over.",
                 &local_289);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_288);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_249 = 1;
    ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&__range2);
    ScriptElement::~ScriptElement
              ((ScriptElement *)
               &builder.script_byte_array_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ScriptElement::~ScriptElement((ScriptElement *)&op_pubkey_num.value_);
    return __return_storage_ptr__;
  }
  local_120.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_script.cpp"
               ,0x2f);
  local_120.filename = local_120.filename + 1;
  local_120.line = 0x5e7;
  local_120.funcname = "CreateMultisigRedeemScript";
  logger::warn<>(&local_120,"pubkey array size is over.");
  op_require_num.value_._6_1_ = 1;
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_140,"CreateMultisigScript pubkeys array size is over.",
             (allocator *)((long)&op_require_num.value_ + 7));
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_140);
  op_require_num.value_._6_1_ = 0;
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Script ScriptUtil::CreateMultisigRedeemScript(
    uint32_t require_signature_num, const std::vector<Pubkey>& pubkeys,
    bool has_witness) {
  if (require_signature_num == 0) {
    warn(CFD_LOG_SOURCE, "Invalid require_sig_num. require_sig_num = 0");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript require_num is 0.");
  }
  if (pubkeys.empty()) {
    warn(CFD_LOG_SOURCE, "pubkey array is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript empty pubkey array.");
  }
  if (require_signature_num > pubkeys.size()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid require_sig_num. require_sig_num={0}, pubkey size={1}.",
        require_signature_num, pubkeys.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript require_num is over.");
  }
  size_t max_num = (has_witness) ? Script::kMaxMultisigPubkeyNum : 15;
  if (pubkeys.size() > max_num) {
    warn(CFD_LOG_SOURCE, "pubkey array size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript pubkeys array size is over.");
  }

  ScriptElement op_require_num(static_cast<int64_t>(require_signature_num));
  ScriptElement op_pubkey_num(static_cast<int64_t>(pubkeys.size()));

  // create script
  ScriptBuilder builder;
  builder << op_require_num;
  for (const Pubkey& pubkey : pubkeys) builder << pubkey;
  builder << op_pubkey_num << ScriptOperator::OP_CHECKMULTISIG;
  Script redeem_script = builder.Build();

  if ((!has_witness) && (!IsValidRedeemScript(redeem_script))) {
    warn(CFD_LOG_SOURCE, "Multisig script size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript multisig script size is over.");
  }
  return redeem_script;
}